

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-value.c
# Opt level: O0

void test_int32(void)

{
  int iVar1;
  VALUE_TYPE VVar2;
  int32_t iVar3;
  uint32_t uVar4;
  int64_t iVar5;
  uint64_t uVar6;
  float fVar7;
  double dVar8;
  VALUE v;
  VALUE_TYPE in_stack_00000044;
  VALUE *in_stack_00000048;
  VALUE *in_stack_ffffffffffffffe8;
  VALUE *in_stack_fffffffffffffff8;
  
  iVar1 = value_init_int32(in_stack_ffffffffffffffe8,0);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x8e,"%s","value_init_int32(NULL, 0) != 0");
  iVar1 = value_init_int32(in_stack_ffffffffffffffe8,0);
  acutest_check_((int)(ulong)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x90,"%s","value_init_int32(&v, 0) == 0");
  VVar2 = value_type((VALUE *)&stack0xfffffffffffffff0);
  acutest_check_((int)(ulong)(VVar2 == VALUE_INT32),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x91,"%s","value_type(&v) == VALUE_INT32");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x92,"%s","!value_is_compatible(&v, VALUE_NULL)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x93,"%s","!value_is_compatible(&v, VALUE_BOOL)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x94,"%s","value_is_compatible(&v, VALUE_INT32)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x95,"%s","value_is_compatible(&v, VALUE_UINT32)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x96,"%s","value_is_compatible(&v, VALUE_INT64)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x97,"%s","value_is_compatible(&v, VALUE_UINT64)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x98,"%s","value_is_compatible(&v, VALUE_FLOAT)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x99,"%s","value_is_compatible(&v, VALUE_DOUBLE)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x9a,"%s","!value_is_compatible(&v, VALUE_ARRAY)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x9b,"%s","!value_is_compatible(&v, VALUE_DICT)");
  iVar3 = value_int32((VALUE *)v.data._0_8_);
  acutest_check_((int)(ulong)(iVar3 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x9c,"%s","value_int32(&v) == 0");
  uVar4 = value_uint32((VALUE *)v.data._0_8_);
  acutest_check_((int)(ulong)(uVar4 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x9d,"%s","value_uint32(&v) == 0");
  iVar5 = value_int64((VALUE *)v.data._0_8_);
  acutest_check_((int)(ulong)(iVar5 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x9e,"%s","value_int64(&v) == 0");
  uVar6 = value_uint64((VALUE *)v.data._0_8_);
  acutest_check_((int)(ulong)(uVar6 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x9f,"%s","value_uint64(&v) == 0");
  fVar7 = value_float((VALUE *)v.data._0_8_);
  iVar1 = FLOAT_EQ(fVar7,0.0);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xa0,"%s","FLOAT_EQ(value_float(&v), 0.0f)");
  dVar8 = value_double(in_stack_fffffffffffffff8);
  iVar1 = DOUBLE_EQ(dVar8,0.0);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xa1,"%s","DOUBLE_EQ(value_double(&v), 0.0)");
  value_fini((VALUE *)0x105be8);
  value_init_int32(in_stack_ffffffffffffffe8,0);
  VVar2 = value_type((VALUE *)&stack0xfffffffffffffff0);
  acutest_check_((int)(ulong)(VVar2 == VALUE_INT32),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xa5,"%s","value_type(&v) == VALUE_INT32");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xa6,"%s","!value_is_compatible(&v, VALUE_NULL)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xa7,"%s","!value_is_compatible(&v, VALUE_BOOL)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xa8,"%s","value_is_compatible(&v, VALUE_INT32)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xa9,"%s","!value_is_compatible(&v, VALUE_UINT32)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xaa,"%s","value_is_compatible(&v, VALUE_INT64)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xab,"%s","!value_is_compatible(&v, VALUE_UINT64)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xac,"%s","value_is_compatible(&v, VALUE_FLOAT)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xad,"%s","value_is_compatible(&v, VALUE_DOUBLE)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xae,"%s","!value_is_compatible(&v, VALUE_ARRAY)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xaf,"%s","!value_is_compatible(&v, VALUE_DICT)");
  iVar3 = value_int32((VALUE *)v.data._0_8_);
  acutest_check_((int)(ulong)(iVar3 == -1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xb0,"%s","value_int32(&v) == -1");
  iVar5 = value_int64((VALUE *)v.data._0_8_);
  acutest_check_((int)(ulong)(iVar5 == -1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xb1,"%s","value_int64(&v) == -1");
  fVar7 = value_float((VALUE *)v.data._0_8_);
  iVar1 = FLOAT_EQ(fVar7,-1.0);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xb2,"%s","FLOAT_EQ(value_float(&v), -1.0f)");
  dVar8 = value_double(in_stack_fffffffffffffff8);
  iVar1 = DOUBLE_EQ(dVar8,-1.0);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xb3,"%s","DOUBLE_EQ(value_double(&v), -1.0)");
  value_fini((VALUE *)0x105fbd);
  value_init_int32(in_stack_ffffffffffffffe8,0);
  VVar2 = value_type((VALUE *)&stack0xfffffffffffffff0);
  acutest_check_((int)(ulong)(VVar2 == VALUE_INT32),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xb7,"%s","value_type(&v) == VALUE_INT32");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xb8,"%s","!value_is_compatible(&v, VALUE_NULL)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xb9,"%s","!value_is_compatible(&v, VALUE_BOOL)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xba,"%s","value_is_compatible(&v, VALUE_INT32)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xbb,"%s","!value_is_compatible(&v, VALUE_UINT32)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xbc,"%s","value_is_compatible(&v, VALUE_INT64)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xbd,"%s","!value_is_compatible(&v, VALUE_UINT64)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xbe,"%s","value_is_compatible(&v, VALUE_FLOAT)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xbf,"%s","value_is_compatible(&v, VALUE_DOUBLE)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xc0,"%s","!value_is_compatible(&v, VALUE_ARRAY)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xc1,"%s","!value_is_compatible(&v, VALUE_DICT)");
  iVar3 = value_int32((VALUE *)v.data._0_8_);
  acutest_check_((int)(ulong)(iVar3 == -0x80000000),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xc2,"%s","value_int32(&v) == INT32_MIN");
  value_fini((VALUE *)0x1062cb);
  value_init_int32(in_stack_ffffffffffffffe8,0);
  VVar2 = value_type((VALUE *)&stack0xfffffffffffffff0);
  acutest_check_((int)(ulong)(VVar2 == VALUE_INT32),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xc6,"%s","value_type(&v) == VALUE_INT32");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,199,"%s","!value_is_compatible(&v, VALUE_NULL)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,200,"%s","!value_is_compatible(&v, VALUE_BOOL)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xc9,"%s","value_is_compatible(&v, VALUE_INT32)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xca,"%s","value_is_compatible(&v, VALUE_UINT32)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xcb,"%s","value_is_compatible(&v, VALUE_INT64)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xcc,"%s","value_is_compatible(&v, VALUE_UINT64)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xcd,"%s","value_is_compatible(&v, VALUE_FLOAT)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xce,"%s","value_is_compatible(&v, VALUE_DOUBLE)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xcf,"%s","!value_is_compatible(&v, VALUE_ARRAY)");
  iVar1 = value_is_compatible(in_stack_00000048,in_stack_00000044);
  acutest_check_((int)(ulong)((iVar1 != 0 ^ 0xffU) & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xd0,"%s","!value_is_compatible(&v, VALUE_DICT)");
  iVar3 = value_int32((VALUE *)v.data._0_8_);
  acutest_check_((int)(ulong)(iVar3 == 0x7fffffff),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xd1,"%s","value_int32(&v) == INT32_MAX");
  value_fini((VALUE *)0x1065d5);
  return;
}

Assistant:

static void
test_int32(void)
{
    VALUE v;

    TEST_CHECK(value_init_int32(NULL, 0) != 0);

    TEST_CHECK(value_init_int32(&v, 0) == 0);
    TEST_CHECK(value_type(&v) == VALUE_INT32);
    TEST_CHECK(!value_is_compatible(&v, VALUE_NULL));
    TEST_CHECK(!value_is_compatible(&v, VALUE_BOOL));
    TEST_CHECK(value_is_compatible(&v, VALUE_INT32));
    TEST_CHECK(value_is_compatible(&v, VALUE_UINT32));
    TEST_CHECK(value_is_compatible(&v, VALUE_INT64));
    TEST_CHECK(value_is_compatible(&v, VALUE_UINT64));
    TEST_CHECK(value_is_compatible(&v, VALUE_FLOAT));
    TEST_CHECK(value_is_compatible(&v, VALUE_DOUBLE));
    TEST_CHECK(!value_is_compatible(&v, VALUE_ARRAY));
    TEST_CHECK(!value_is_compatible(&v, VALUE_DICT));
    TEST_CHECK(value_int32(&v) == 0);
    TEST_CHECK(value_uint32(&v) == 0);
    TEST_CHECK(value_int64(&v) == 0);
    TEST_CHECK(value_uint64(&v) == 0);
    TEST_CHECK(FLOAT_EQ(value_float(&v), 0.0f));
    TEST_CHECK(DOUBLE_EQ(value_double(&v), 0.0));
    value_fini(&v);

    value_init_int32(&v, -1);
    TEST_CHECK(value_type(&v) == VALUE_INT32);
    TEST_CHECK(!value_is_compatible(&v, VALUE_NULL));
    TEST_CHECK(!value_is_compatible(&v, VALUE_BOOL));
    TEST_CHECK(value_is_compatible(&v, VALUE_INT32));
    TEST_CHECK(!value_is_compatible(&v, VALUE_UINT32));
    TEST_CHECK(value_is_compatible(&v, VALUE_INT64));
    TEST_CHECK(!value_is_compatible(&v, VALUE_UINT64));
    TEST_CHECK(value_is_compatible(&v, VALUE_FLOAT));
    TEST_CHECK(value_is_compatible(&v, VALUE_DOUBLE));
    TEST_CHECK(!value_is_compatible(&v, VALUE_ARRAY));
    TEST_CHECK(!value_is_compatible(&v, VALUE_DICT));
    TEST_CHECK(value_int32(&v) == -1);
    TEST_CHECK(value_int64(&v) == -1);
    TEST_CHECK(FLOAT_EQ(value_float(&v), -1.0f));
    TEST_CHECK(DOUBLE_EQ(value_double(&v), -1.0));
    value_fini(&v);

    value_init_int32(&v, INT32_MIN);
    TEST_CHECK(value_type(&v) == VALUE_INT32);
    TEST_CHECK(!value_is_compatible(&v, VALUE_NULL));
    TEST_CHECK(!value_is_compatible(&v, VALUE_BOOL));
    TEST_CHECK(value_is_compatible(&v, VALUE_INT32));
    TEST_CHECK(!value_is_compatible(&v, VALUE_UINT32));
    TEST_CHECK(value_is_compatible(&v, VALUE_INT64));
    TEST_CHECK(!value_is_compatible(&v, VALUE_UINT64));
    TEST_CHECK(value_is_compatible(&v, VALUE_FLOAT));
    TEST_CHECK(value_is_compatible(&v, VALUE_DOUBLE));
    TEST_CHECK(!value_is_compatible(&v, VALUE_ARRAY));
    TEST_CHECK(!value_is_compatible(&v, VALUE_DICT));
    TEST_CHECK(value_int32(&v) == INT32_MIN);
    value_fini(&v);

    value_init_int32(&v, INT32_MAX);
    TEST_CHECK(value_type(&v) == VALUE_INT32);
    TEST_CHECK(!value_is_compatible(&v, VALUE_NULL));
    TEST_CHECK(!value_is_compatible(&v, VALUE_BOOL));
    TEST_CHECK(value_is_compatible(&v, VALUE_INT32));
    TEST_CHECK(value_is_compatible(&v, VALUE_UINT32));
    TEST_CHECK(value_is_compatible(&v, VALUE_INT64));
    TEST_CHECK(value_is_compatible(&v, VALUE_UINT64));
    TEST_CHECK(value_is_compatible(&v, VALUE_FLOAT));
    TEST_CHECK(value_is_compatible(&v, VALUE_DOUBLE));
    TEST_CHECK(!value_is_compatible(&v, VALUE_ARRAY));
    TEST_CHECK(!value_is_compatible(&v, VALUE_DICT));
    TEST_CHECK(value_int32(&v) == INT32_MAX);
    value_fini(&v);
}